

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void rename_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  void *pvVar1;
  VARR_ssa_edge_t *pVVar2;
  ssa_edge_t_conflict psVar3;
  MIR_insn_t insn;
  MIR_insn_t insn_00;
  MIR_reg_t reg;
  bb_insn_t_conflict bb_insn_00;
  int iVar4;
  MIR_reg_t new_reg;
  long lVar5;
  ssa_edge_t_conflict *__ptr;
  ulong uVar6;
  size_t sVar7;
  char *op;
  ulong in_R9;
  MIR_op_t *op_ref;
  MIR_reg_t var;
  int op_num;
  MIR_op_t *local_68;
  MIR_insn_t local_60;
  bb_insn_t_conflict local_58;
  insn_var_iterator_t iter;
  
  local_60 = bb_insn->insn;
  iter.nops = (size_t)*(uint *)&local_60->field_0x1c;
  local_68 = local_60->ops;
  iter.op_num = 0;
  iter.op_part_num = 0;
  local_58 = bb_insn;
  iter.insn = local_60;
  while( true ) {
    while( true ) {
      do {
        do {
          iVar4 = output_insn_var_iterator_next(gen_ctx,&iter,&var,&op_num);
          bb_insn_00 = local_58;
          reg = var;
          if (iVar4 == 0) {
            return;
          }
        } while (var < 0x22);
        lVar5 = (long)op_num;
        pvVar1 = local_68[lVar5].data;
      } while ((pvVar1 != (void *)0x0) && (*(char *)((long)pvVar1 + 0x10) != '\0'));
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fprintf((FILE *)gen_ctx->debug_file,"  Start def insn %-5lu",(ulong)local_58->index);
        print_bb_insn(gen_ctx,bb_insn_00,0);
      }
      op_ref = local_68 + lVar5;
      new_reg = get_new_ssa_reg(gen_ctx,reg,0x40,0);
      if (pvVar1 != (void *)0x0) break;
      if (new_reg != 0xffffffff) {
        rename_op_reg(gen_ctx,op_ref,reg,new_reg,local_60,(int)in_R9);
      }
    }
    pVVar2 = gen_ctx->ssa_ctx->ssa_edges_to_process;
    if ((pVVar2 == (VARR_ssa_edge_t *)0x0) || (pVVar2->varr == (ssa_edge_t_conflict *)0x0)) break;
    pVVar2->els_num = 0;
    while (psVar3 = (ssa_edge_t_conflict)op_ref->data, psVar3 != (ssa_edge_t_conflict)0x0) {
      if (psVar3->flag == '\0') {
        pVVar2 = gen_ctx->ssa_ctx->ssa_edges_to_process;
        __ptr = pVVar2->varr;
        if (__ptr == (ssa_edge_t_conflict *)0x0) {
          op = "expand";
          goto LAB_00139429;
        }
        sVar7 = pVVar2->els_num;
        uVar6 = sVar7 + 1;
        if (pVVar2->size < uVar6) {
          sVar7 = (uVar6 >> 1) + uVar6;
          __ptr = (ssa_edge_t_conflict *)realloc(__ptr,sVar7 * 8);
          pVVar2->varr = __ptr;
          pVVar2->size = sVar7;
          sVar7 = pVVar2->els_num;
          uVar6 = sVar7 + 1;
        }
        pVVar2->els_num = uVar6;
        __ptr[sVar7] = psVar3;
        psVar3->flag = '\x01';
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          in_R9 = (ulong)psVar3->use_op_num;
          fprintf((FILE *)gen_ctx->debug_file,
                  "     Adding ssa edge: def %lu:%d -> use %lu:%d:\n      ",
                  (ulong)psVar3->def->index,(ulong)psVar3->def_op_num,(ulong)psVar3->use->index);
          print_bb_insn(gen_ctx,psVar3->def,0);
          fwrite("     ",5,1,(FILE *)gen_ctx->debug_file);
          print_bb_insn(gen_ctx,psVar3->use,0);
        }
      }
      op_ref = (MIR_op_t *)&psVar3->next_use;
    }
    if (new_reg != 0xffffffff) {
      while( true ) {
        pVVar2 = gen_ctx->ssa_ctx->ssa_edges_to_process;
        if (pVVar2 == (VARR_ssa_edge_t *)0x0) {
          op = "length";
          goto LAB_00139429;
        }
        sVar7 = pVVar2->els_num;
        if (sVar7 == 0) break;
        if (pVVar2->varr == (ssa_edge_t_conflict *)0x0) {
          op = "pop";
          goto LAB_00139429;
        }
        pVVar2->els_num = sVar7 - 1;
        psVar3 = pVVar2->varr[sVar7 - 1];
        insn = psVar3->use->insn;
        insn_00 = psVar3->def->insn;
        rename_op_reg(gen_ctx,insn_00->ops + psVar3->def_op_num,reg,new_reg,insn_00,(int)in_R9);
        rename_op_reg(gen_ctx,insn->ops + psVar3->use_op_num,reg,new_reg,insn,(int)in_R9);
      }
    }
  }
  op = "trunc";
LAB_00139429:
  mir_varr_assert_fail(op,"ssa_edge_t");
}

Assistant:

static void rename_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  int op_num;
  MIR_reg_t var, reg, new_reg;
  MIR_insn_t insn, def_insn, use_insn;
  ssa_edge_t ssa_edge;
  insn_var_iterator_t iter;

  insn = bb_insn->insn;
  FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    if (var <= MAX_HARD_REG) continue;
    ssa_edge = insn->ops[op_num].data;
    if (ssa_edge != NULL && ssa_edge->flag) continue; /* already processed */
    DEBUG (2, {
      fprintf (debug_file, "  Start def insn %-5lu", (long unsigned) bb_insn->index);
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    reg = var;
    new_reg = get_new_ssa_reg (gen_ctx, reg, '@', FALSE);
    if (ssa_edge == NULL) { /* special case: unused output */
      if (new_reg != MIR_NON_VAR)
        rename_op_reg (gen_ctx, &insn->ops[op_num], reg, new_reg, insn, TRUE);
      continue;
    }
    VARR_TRUNC (ssa_edge_t, ssa_edges_to_process, 0);
    process_insn_to_rename (gen_ctx, insn, op_num);
    if (new_reg != MIR_NON_VAR) {
      while (pop_to_rename (gen_ctx, &ssa_edge)) {
        def_insn = ssa_edge->def->insn;
        use_insn = ssa_edge->use->insn;
        rename_op_reg (gen_ctx, &def_insn->ops[ssa_edge->def_op_num], reg, new_reg, def_insn, TRUE);
        rename_op_reg (gen_ctx, &use_insn->ops[ssa_edge->use_op_num], reg, new_reg, use_insn, TRUE);
      }
    }
  }
}